

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmainct.c
# Opt level: O0

void process_data_simple_main
               (j_decompress_ptr cinfo,JSAMPARRAY output_buf,JDIMENSION *out_row_ctr,
               JDIMENSION out_rows_avail)

{
  uint uVar1;
  jpeg_d_main_controller *pjVar2;
  int iVar3;
  JDIMENSION rowgroups_avail;
  my_main_ptr main;
  JDIMENSION out_rows_avail_local;
  JDIMENSION *out_row_ctr_local;
  JSAMPARRAY output_buf_local;
  j_decompress_ptr cinfo_local;
  
  pjVar2 = cinfo->main;
  if (*(int *)&pjVar2[6].start_pass == 0) {
    iVar3 = (*cinfo->coef->decompress_data)(cinfo,(JSAMPIMAGE)(pjVar2 + 1));
    if (iVar3 == 0) {
      return;
    }
    *(undefined4 *)&pjVar2[6].start_pass = 1;
  }
  uVar1 = cinfo->min_DCT_v_scaled_size;
  (*cinfo->post->post_process_data)
            (cinfo,(JSAMPIMAGE)(pjVar2 + 1),(JDIMENSION *)((long)&pjVar2[6].start_pass + 4),uVar1,
             output_buf,out_row_ctr,out_rows_avail);
  if (uVar1 <= *(uint *)((long)&pjVar2[6].start_pass + 4)) {
    *(undefined4 *)&pjVar2[6].start_pass = 0;
    *(undefined4 *)((long)&pjVar2[6].start_pass + 4) = 0;
  }
  return;
}

Assistant:

METHODDEF(void)
process_data_simple_main (j_decompress_ptr cinfo,
			  JSAMPARRAY output_buf, JDIMENSION *out_row_ctr,
			  JDIMENSION out_rows_avail)
{
  my_main_ptr main = (my_main_ptr) cinfo->main;
  JDIMENSION rowgroups_avail;

  /* Read input data if we haven't filled the main buffer yet */
  if (! main->buffer_full) {
    if (! (*cinfo->coef->decompress_data) (cinfo, main->buffer))
      return;			/* suspension forced, can do nothing more */
    main->buffer_full = TRUE;	/* OK, we have an iMCU row to work with */
  }

  /* There are always min_DCT_scaled_size row groups in an iMCU row. */
  rowgroups_avail = (JDIMENSION) cinfo->min_DCT_v_scaled_size;
  /* Note: at the bottom of the image, we may pass extra garbage row groups
   * to the postprocessor.  The postprocessor has to check for bottom
   * of image anyway (at row resolution), so no point in us doing it too.
   */

  /* Feed the postprocessor */
  (*cinfo->post->post_process_data) (cinfo, main->buffer,
				     &main->rowgroup_ctr, rowgroups_avail,
				     output_buf, out_row_ctr, out_rows_avail);

  /* Has postprocessor consumed all the data yet? If so, mark buffer empty */
  if (main->rowgroup_ctr >= rowgroups_avail) {
    main->buffer_full = FALSE;
    main->rowgroup_ctr = 0;
  }
}